

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateUnary(OptimizeInstructions *this,Unary *unaryOuter)

{
  UnaryOp UVar1;
  Index IVar2;
  Expression *pEVar3;
  
  pEVar3 = unaryOuter->value;
  if ((pEVar3->_id == UnaryId) && (UVar1 = *(UnaryOp *)(pEVar3 + 1), UVar1 == unaryOuter->op)) {
    if ((int)UVar1 < 0x14) {
      if (UVar1 - AbsFloat32 < 10) {
        return pEVar3;
      }
      if (1 < UVar1 - NegFloat32) {
        return (Expression *)0x0;
      }
    }
    else {
      if (UVar1 - ExtendS8Int32 < 2) {
        if (((((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
              .currModule)->features).features & 0x20) != 0) {
          return pEVar3;
        }
        __assert_fail("getModule()->features.hasSignExt()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x12e9,"Expression *wasm::OptimizeInstructions::deduplicateUnary(Unary *)");
      }
      if (UVar1 != EqZInt32) {
        return (Expression *)0x0;
      }
      IVar2 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)pEVar3[1].type.id,this);
      if (IVar2 != 1) goto LAB_009d5566;
    }
    pEVar3 = (Expression *)pEVar3[1].type.id;
  }
  else {
LAB_009d5566:
    pEVar3 = (Expression *)0x0;
  }
  return pEVar3;
}

Assistant:

Expression* deduplicateUnary(Unary* unaryOuter) {
    if (auto* unaryInner = unaryOuter->value->dynCast<Unary>()) {
      if (unaryInner->op == unaryOuter->op) {
        switch (unaryInner->op) {
          case NegFloat32:
          case NegFloat64: {
            // neg(neg(x))  ==>   x
            return unaryInner->value;
          }
          case AbsFloat32:
          case CeilFloat32:
          case FloorFloat32:
          case TruncFloat32:
          case NearestFloat32:
          case AbsFloat64:
          case CeilFloat64:
          case FloorFloat64:
          case TruncFloat64:
          case NearestFloat64: {
            // unaryOp(unaryOp(x))  ==>   unaryOp(x)
            return unaryInner;
          }
          case ExtendS8Int32:
          case ExtendS16Int32: {
            assert(getModule()->features.hasSignExt());
            return unaryInner;
          }
          case EqZInt32: {
            // eqz(eqz(bool(x)))  ==>   bool(x)
            if (Bits::getMaxBits(unaryInner->value, this) == 1) {
              return unaryInner->value;
            }
            break;
          }
          default: {
          }
        }
      }
    }
    return nullptr;
  }